

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_mount_internal(char *args,MountType mnttype)

{
  int iVar1;
  int iVar2;
  long lVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  size_t __size;
  void *__ptr;
  size_t sVar6;
  undefined8 uVar7;
  long len;
  void *buf;
  FILE *in;
  PHYSFS_File *f;
  int rc;
  int appending;
  char *mntpoint;
  char *ptr;
  char *pcStack_18;
  MountType mnttype_local;
  char *args_local;
  
  f._0_4_ = 0;
  if (*args == '\"') {
    pcStack_18 = args + 1;
    mntpoint = strchr(pcStack_18,0x22);
    if (mntpoint == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *mntpoint = '\0';
  }
  else {
    mntpoint = strchr(args,0x20);
    *mntpoint = '\0';
    pcStack_18 = args;
  }
  _rc = mntpoint + 1;
  if (*_rc == '\"') {
    _rc = mntpoint + 2;
    mntpoint = strchr(_rc,0x22);
    if (mntpoint == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *mntpoint = '\0';
  }
  else {
    mntpoint = strchr(_rc,0x20);
    *mntpoint = '\0';
  }
  iVar1 = atoi(mntpoint + 1);
  if (mnttype == MNTTYPE_PATH) {
    f._0_4_ = PHYSFS_mount(pcStack_18,_rc,iVar1);
  }
  else if (mnttype == MNTTYPE_HANDLE) {
    lVar3 = PHYSFS_openRead(pcStack_18);
    if (lVar3 == 0) {
      uVar7 = PHYSFS_getLastError();
      printf("PHYSFS_openRead(\'%s\') failed. reason: %s.\n",pcStack_18,uVar7);
      return 1;
    }
    f._0_4_ = PHYSFS_mountHandle(lVar3,pcStack_18,_rc,iVar1);
    if ((int)f == 0) {
      PHYSFS_close(lVar3);
    }
  }
  else if (mnttype == MNTTYPE_MEMORY) {
    __stream = fopen(pcStack_18,"rb");
    if (__stream == (FILE *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("Failed to open %s to read into memory: %s.\n",pcStack_18,pcVar5);
      return 1;
    }
    iVar2 = fseek(__stream,0,2);
    if ((iVar2 != 0) || (__size = ftell(__stream), (long)__size < 0)) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("Failed to find size of %s to read into memory: %s.\n",pcStack_18,pcVar5);
      fclose(__stream);
      return 1;
    }
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("Failed to allocate space to read %s into memory: %s.\n",pcStack_18,pcVar5);
      fclose(__stream);
      return 1;
    }
    iVar2 = fseek(__stream,0,0);
    if ((iVar2 != 0) || (sVar6 = fread(__ptr,__size,1,__stream), sVar6 != 1)) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("Failed to read %s into memory: %s.\n",pcStack_18,pcVar5);
      fclose(__stream);
      free(__ptr);
      return 1;
    }
    fclose(__stream);
    f._0_4_ = PHYSFS_mountMemory(__ptr,__size,freeBuf,pcStack_18,_rc,iVar1);
  }
  if ((int)f == 0) {
    uVar7 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar7);
  }
  else {
    printf("Successful.\n");
  }
  return 1;
}

Assistant:

static int cmd_mount_internal(char *args, const MountType mnttype)
{
    char *ptr;
    char *mntpoint = NULL;
    int appending = 0;
    int rc = 0;

    if (*args == '\"')
    {
        args++;
        ptr = strchr(args, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(args, ' ');
        *ptr = '\0';
    } /* else */

    mntpoint = ptr + 1;
    if (*mntpoint == '\"')
    {
        mntpoint++;
        ptr = strchr(mntpoint, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(mntpoint, ' ');
        *(ptr) = '\0';
    } /* else */
    appending = atoi(ptr + 1);

    /*printf("[%s], [%s], [%d]\n", args, mntpoint, appending);*/

    if (mnttype == MNTTYPE_PATH)
        rc = PHYSFS_mount(args, mntpoint, appending);

    else if (mnttype == MNTTYPE_HANDLE)
    {
        PHYSFS_File *f = PHYSFS_openRead(args);
        if (f == NULL)
        {
            printf("PHYSFS_openRead('%s') failed. reason: %s.\n", args, PHYSFS_getLastError());
            return 1;
        } /* if */

        rc = PHYSFS_mountHandle(f, args, mntpoint, appending);
        if (!rc)
            PHYSFS_close(f);
    } /* else if */

    else if (mnttype == MNTTYPE_MEMORY)
    {
        FILE *in = fopen(args, "rb");
        void *buf = NULL;
        long len = 0;

        if (in == NULL)
        {
            printf("Failed to open %s to read into memory: %s.\n", args, strerror(errno));
            return 1;
        } /* if */

        if ( (fseek(in, 0, SEEK_END) != 0) || ((len = ftell(in)) < 0) )
        {
            printf("Failed to find size of %s to read into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        buf = malloc(len);
        if (buf == NULL)
        {
            printf("Failed to allocate space to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        if ((fseek(in, 0, SEEK_SET) != 0) || (fread(buf, len, 1, in) != 1))
        {
            printf("Failed to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            free(buf);
            return 1;
        } /* if */

        fclose(in);

        rc = PHYSFS_mountMemory(buf, len, freeBuf, args, mntpoint, appending);
    } /* else */

    if (rc)
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}